

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

string * __thiscall
cmComputeLinkInformation::GetRPathString_abi_cxx11_
          (string *__return_storage_ptr__,cmComputeLinkInformation *this,bool for_install)

{
  string *psVar1;
  ulong uVar2;
  string local_90;
  ulong local_70;
  size_type minLength;
  string_view local_58;
  undefined1 local_45;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  runtimeDirs;
  bool for_install_local;
  cmComputeLinkInformation *this_local;
  string *rpath;
  
  runtimeDirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = for_install;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38);
  GetRPath(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38,
           (bool)(runtimeDirs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
  local_45 = 0;
  psVar1 = GetRuntimeSep_abi_cxx11_(this);
  local_58 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar1)
  ;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&minLength);
  cmJoin(__return_storage_ptr__,
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_38,local_58,_minLength);
  if (((runtimeDirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) &&
     ((this->RuntimeUseChrpath & 1U) != 0)) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      psVar1 = GetRuntimeSep_abi_cxx11_(this);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar1);
    }
    GetChrpathString_abi_cxx11_(&local_90,this);
    uVar2 = std::__cxx11::string::length();
    std::__cxx11::string::~string((string *)&local_90);
    local_70 = uVar2;
    while( true ) {
      uVar2 = std::__cxx11::string::length();
      if (local_70 <= uVar2) break;
      psVar1 = GetRuntimeSep_abi_cxx11_(this);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar1);
    }
  }
  local_45 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmComputeLinkInformation::GetRPathString(bool for_install) const
{
  // Get the directories to use.
  std::vector<std::string> runtimeDirs;
  this->GetRPath(runtimeDirs, for_install);

  // Concatenate the paths.
  std::string rpath = cmJoin(runtimeDirs, this->GetRuntimeSep());

  // If the rpath will be replaced at install time, prepare space.
  if (!for_install && this->RuntimeUseChrpath) {
    if (!rpath.empty()) {
      // Add one trailing separator so the linker does not reuse the
      // rpath .dynstr entry for a symbol name that happens to match
      // the end of the rpath string.
      rpath += this->GetRuntimeSep();
    }

    // Make sure it is long enough to hold the replacement value.
    std::string::size_type minLength = this->GetChrpathString().length();
    while (rpath.length() < minLength) {
      rpath += this->GetRuntimeSep();
    }
  }

  return rpath;
}